

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O3

int ffgtbc(fitsfile *fptr,LONGLONG *totalwidth,int *status)

{
  long lVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  ushort **ppuVar5;
  long lVar6;
  char *pcVar7;
  tcolumn *ptVar8;
  int iVar9;
  char message [81];
  char acStack_88 [88];
  
  if (0 < *status) {
    return *status;
  }
  if (fptr->HDUposition == fptr->Fptr->curhdu) {
    if ((fptr->Fptr->datastart == -1) && (iVar4 = ffrdef(fptr,status), 0 < iVar4))
    goto LAB_0014690e;
  }
  else {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  iVar4 = fptr->Fptr->tfield;
  ptVar8 = fptr->Fptr->tableptr;
  *totalwidth = 0;
  if (0 < iVar4) {
    lVar6 = 0;
    iVar9 = 0;
    do {
      ptVar8->tbcol = lVar6;
      uVar3 = ptVar8->tdatatype;
      if (uVar3 == 1) {
        lVar1 = ptVar8->trepeat + 7;
        lVar6 = ptVar8->trepeat + 0xe;
        if (-1 < lVar1) {
          lVar6 = lVar1;
        }
        lVar6 = lVar6 >> 3;
      }
      else if (uVar3 == 0x10) {
        lVar6 = ptVar8->trepeat;
      }
      else if ((int)uVar3 < 1) {
        ppuVar5 = __ctype_b_loc();
        pcVar7 = ptVar8->tform;
        do {
          cVar2 = *pcVar7;
          pcVar7 = pcVar7 + 1;
        } while ((*(byte *)((long)*ppuVar5 + (long)cVar2 * 2 + 1) & 8) != 0);
        if (cVar2 == 'Q') {
          lVar6 = ptVar8->trepeat << 4;
        }
        else {
          if (cVar2 != 'P') {
            snprintf(acStack_88,0x51,"unknown binary table column type: %s",ptVar8->tform);
            ffxmsg(5,acStack_88);
            *status = 0x105;
            return 0x105;
          }
          lVar6 = ptVar8->trepeat << 3;
        }
      }
      else {
        lVar6 = ((ulong)uVar3 / 10) * ptVar8->trepeat;
      }
      lVar6 = lVar6 + *totalwidth;
      *totalwidth = lVar6;
      iVar9 = iVar9 + 1;
      ptVar8 = ptVar8 + 1;
    } while (iVar9 != iVar4);
  }
LAB_0014690e:
  return *status;
}

Assistant:

int ffgtbc(fitsfile *fptr,    /* I - FITS file pointer          */
           LONGLONG *totalwidth,  /* O - total width of a table row */
           int *status)       /* IO - error status              */
{
/*
  calculate the starting byte offset of each column of a binary table.
  Use the values of the datatype code and repeat counts in the
  column structure. Return the total length of a row, in bytes.
*/
    int tfields, ii;
    LONGLONG nbytes;
    tcolumn *colptr;
    char message[FLEN_ERRMSG], *cptr;

    if (*status > 0)
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               /* rescan header */
            return(*status);

    tfields = (fptr->Fptr)->tfield;
    colptr = (fptr->Fptr)->tableptr;  /* point to first column structure */

    *totalwidth = 0;

    for (ii = 0; ii < tfields; ii++, colptr++)
    {
        colptr->tbcol = *totalwidth;  /* byte offset in row to this column */

        if (colptr->tdatatype == TSTRING)
        {
            nbytes =  colptr->trepeat;   /* one byte per char */
        }
        else if (colptr->tdatatype == TBIT)
        {
            nbytes = ( colptr->trepeat + 7) / 8;
        }
        else if (colptr->tdatatype > 0)
        {
            nbytes =  colptr->trepeat * (colptr->tdatatype / 10);
        }
        else  {
	
	  cptr = colptr->tform;
	  while (isdigit(*cptr)) cptr++;
	
	  if (*cptr == 'P')  
	   /* this is a 'P' variable length descriptor (neg. tdatatype) */
            nbytes = colptr->trepeat * 8;
	  else if (*cptr == 'Q') 
	   /* this is a 'Q' variable length descriptor (neg. tdatatype) */
            nbytes = colptr->trepeat * 16;

	  else {
		snprintf(message,FLEN_ERRMSG,
		"unknown binary table column type: %s", colptr->tform);
		ffpmsg(message);
		*status = BAD_TFORM;
		return(*status);
	  }
 	}

       *totalwidth = *totalwidth + nbytes;
    }
    return(*status);
}